

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O3

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  dynbuf *s;
  char cVar2;
  int *piVar3;
  long lVar4;
  CURLcode CVar5;
  CURLofft CVar6;
  uint uVar7;
  int iVar8;
  fileinfo *pfVar9;
  char *pcVar10;
  long lVar11;
  void *pvVar12;
  curlfiletype cVar13;
  size_t __n;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  char c;
  char *p;
  curl_off_t fsize;
  byte local_59;
  size_t local_58;
  Curl_easy *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  sVar14 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*(long *)((long)connptr + 0x1350) + 0x30);
  if (piVar3[3] == 0) {
    if ((sVar14 == 0) || (*piVar3 != 0)) {
      if (sVar14 == 0) {
        return 0;
      }
    }
    else {
      *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    uVar15 = 0;
    local_58 = sVar14;
    local_50 = (Curl_easy *)connptr;
    local_40 = buffer;
    do {
      local_59 = local_40[uVar15];
      pfVar9 = *(fileinfo **)(piVar3 + 4);
      if (pfVar9 == (fileinfo *)0x0) {
        pfVar9 = Curl_fileinfo_alloc();
        *(fileinfo **)(piVar3 + 4) = pfVar9;
        if (pfVar9 != (fileinfo *)0x0) {
          piVar3[8] = 0;
          piVar3[9] = 0;
          piVar3[6] = 0;
          Curl_dyn_init(&pfVar9->buf,10000);
          pfVar9 = *(fileinfo **)(piVar3 + 4);
          goto LAB_0013533f;
        }
LAB_00135dbd:
        piVar3[3] = 0x1b;
        sVar14 = local_58;
        goto LAB_00135ddf;
      }
LAB_0013533f:
      s = &pfVar9->buf;
      CVar5 = Curl_dyn_addn(s,&local_59,1);
      if (CVar5 != CURLE_OK) goto LAB_00135dbd;
      sVar14 = Curl_dyn_len(s);
      pcVar10 = Curl_dyn_ptr(s);
      if (*piVar3 == 2) {
        switch(piVar3[1]) {
        case 0:
          uVar7 = piVar3[6] + 1;
          piVar3[6] = uVar7;
          if (uVar7 < 9) {
            __n = 0xc;
            pcVar10 = "0123456789-";
LAB_0013587d:
            pvVar12 = memchr(pcVar10,(int)(char)local_59,__n);
            if (pvVar12 == (void *)0x0) goto LAB_00135e07;
          }
          else {
            if ((uVar7 != 9) || (local_59 != 0x20)) goto LAB_00135e07;
            piVar3[1] = 1;
            piVar3[2] = 0;
          }
          break;
        case 1:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (piVar3[2] == 1) {
            if (local_59 != 0x20) {
              __n = 0xf;
              pcVar10 = "APM0123456789:";
              goto LAB_0013587d;
            }
            *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
            pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            piVar3[1] = 2;
            piVar3[2] = 0;
LAB_001357e1:
            piVar3[6] = 0;
          }
          else if (((piVar3[2] == 0) && (local_59 != 9)) && (local_59 != 0x20)) {
LAB_00135bed:
            piVar3[2] = 1;
          }
          break;
        case 2:
          iVar8 = piVar3[2];
          if (iVar8 != 1) goto LAB_0013578d;
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_59 == 0x20) {
            pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            lVar11 = *(long *)(piVar3 + 8);
            iVar8 = strcmp("<DIR>",pcVar10 + lVar11);
            if (iVar8 == 0) {
              (pfVar9->info).filetype = CURLFILETYPE_DIRECTORY;
              (pfVar9->info).size = 0;
              lVar11 = *(long *)(piVar3 + 4);
            }
            else {
              CVar6 = curlx_strtoofft(pcVar10 + lVar11,&local_48,10,&(pfVar9->info).size);
              if (CVar6 != CURL_OFFT_OK) goto LAB_00135e07;
              lVar11 = *(long *)(piVar3 + 4);
              *(undefined4 *)(lVar11 + 8) = 0;
            }
            *(byte *)(lVar11 + 0x60) = *(byte *)(lVar11 + 0x60) | 0x40;
LAB_00135b3e:
            piVar3[6] = 0;
            piVar3[1] = 3;
            piVar3[2] = 0;
          }
          break;
        case 3:
          iVar8 = piVar3[2];
          if (iVar8 == 2) {
            if (local_59 != 10) goto LAB_00135e07;
            *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          }
          else {
            if (iVar8 != 1) goto LAB_0013578d;
            piVar3[6] = piVar3[6] + 1;
            if (local_59 != 10) {
              if (local_59 == 0xd) {
                piVar3[2] = 2;
                pcVar10[sVar14 - 1] = '\0';
              }
              break;
            }
            *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
            pcVar10[sVar14 - 1] = '\0';
          }
          ftp_pl_insert_finfo(local_50,pfVar9);
          piVar3[1] = 0;
          piVar3[2] = 0;
        }
        goto switchD_001353a3_default;
      }
      if (*piVar3 != 1) {
        sVar14 = local_58 + 1;
        goto LAB_00135ddf;
      }
      switch(piVar3[1]) {
      case 0:
        if (piVar3[2] == 1) {
          uVar7 = piVar3[6];
          piVar3[6] = uVar7 + 1;
          if (local_59 == 10) {
            pcVar10[uVar7] = '\0';
            iVar8 = strncmp("total ",pcVar10,6);
            if (iVar8 == 0) {
              pcVar16 = pcVar10 + 7;
              for (pcVar10 = pcVar10 + 6; (cVar2 = *pcVar10, cVar2 == '\t' || (cVar2 == ' '));
                  pcVar10 = pcVar10 + 1) {
                pcVar16 = pcVar16 + 1;
              }
              while ((byte)(cVar2 - 0x30U) < 10) {
                cVar2 = *pcVar16;
                pcVar16 = pcVar16 + 1;
              }
              if (cVar2 == '\0') {
                piVar3[1] = 1;
                Curl_dyn_reset(s);
                break;
              }
            }
            goto LAB_00135e07;
          }
          if (local_59 == 0xd) {
            piVar3[6] = uVar7;
            Curl_dyn_setlen(s,sVar14 - 1);
          }
          break;
        }
        if (piVar3[2] != 0) break;
        if (local_59 == 0x74) {
          piVar3[2] = 1;
          piVar3[6] = piVar3[6] + 1;
          break;
        }
        piVar3[1] = 1;
        Curl_dyn_reset(s);
        goto LAB_00135da1;
      case 1:
        if (local_59 < 100) {
          if (local_59 < 0x62) {
            cVar13 = CURLFILETYPE_FILE;
            if (local_59 != 0x2d) {
              if (local_59 != 0x44) goto LAB_00135e07;
              cVar13 = CURLFILETYPE_DOOR;
            }
          }
          else if (local_59 == 0x62) {
            cVar13 = CURLFILETYPE_DEVICE_BLOCK;
          }
          else {
            if (local_59 != 99) goto LAB_00135e07;
            cVar13 = CURLFILETYPE_DEVICE_CHAR;
          }
        }
        else if (local_59 < 0x70) {
          if (local_59 == 100) {
            cVar13 = CURLFILETYPE_DIRECTORY;
          }
          else {
            if (local_59 != 0x6c) goto LAB_00135e07;
            cVar13 = CURLFILETYPE_SYMLINK;
          }
        }
        else if (local_59 == 0x70) {
          cVar13 = CURLFILETYPE_NAMEDPIPE;
        }
        else {
          if (local_59 != 0x73) goto LAB_00135e07;
          cVar13 = CURLFILETYPE_SOCKET;
        }
        (pfVar9->info).filetype = cVar13;
        piVar3[1] = 2;
        piVar3[6] = 0;
        piVar3[8] = 1;
        piVar3[9] = 0;
        break;
      case 2:
        uVar7 = piVar3[6] + 1;
        piVar3[6] = uVar7;
        if (uVar7 < 10) {
          __n = 9;
          pcVar10 = "rwx-tTsS";
          goto LAB_0013587d;
        }
        if (uVar7 == 10) {
          if (local_59 == 0x20) {
            pcVar10[10] = '\0';
            lVar11 = *(long *)(piVar3 + 8);
            uVar7 = ftp_pl_get_permission(pcVar10 + lVar11);
            if (uVar7 < 0x1000000) {
              lVar4 = *(long *)(piVar3 + 4);
              puVar1 = (uint *)(lVar4 + 0x60);
              *puVar1 = *puVar1 | 8;
              *(uint *)(lVar4 + 0x18) = uVar7;
              *(long *)(piVar3 + 0x12) = lVar11;
              goto LAB_00135b3e;
            }
          }
          goto LAB_00135e07;
        }
        break;
      case 3:
        iVar8 = piVar3[2];
        if (iVar8 == 1) {
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_59 == 0x20) {
            pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            lVar11 = strtol(pcVar10 + *(long *)(piVar3 + 8),&local_48,10);
            if ((*local_48 == '\0') && (lVar11 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar4 = *(long *)(piVar3 + 4);
              puVar1 = (uint *)(lVar4 + 0x60);
              *puVar1 = *puVar1 | 0x80;
              *(long *)(lVar4 + 0x30) = lVar11;
            }
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[1] = 4;
            piVar3[2] = 0;
          }
          else {
LAB_00135965:
            if (9 < (byte)(local_59 - 0x30)) goto LAB_00135e07;
          }
        }
        else {
LAB_00135758:
          if ((iVar8 == 0) && (local_59 != 0x20)) {
            if ((byte)(local_59 - 0x30) < 10) goto LAB_001357a0;
            goto LAB_00135e07;
          }
        }
        break;
      case 4:
        iVar8 = piVar3[2];
        if (iVar8 == 1) {
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_59 == 0x20) {
            pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
            piVar3[1] = 5;
            piVar3[2] = 0;
LAB_0013573e:
            piVar3[8] = 0;
            piVar3[9] = 0;
            goto LAB_001357e1;
          }
        }
        else {
LAB_0013578d:
          if (iVar8 == 0) goto switchD_0013559d_caseD_0;
        }
        break;
      case 5:
        iVar8 = piVar3[2];
        if (iVar8 != 1) goto LAB_0013578d;
        iVar8 = piVar3[6];
        piVar3[6] = iVar8 + 1U;
        if (local_59 == 0x20) {
          pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 6;
          piVar3[2] = 0;
          goto LAB_0013573e;
        }
        break;
      case 6:
        iVar8 = piVar3[2];
        if (iVar8 != 1) goto LAB_00135758;
        iVar8 = piVar3[6];
        piVar3[6] = iVar8 + 1U;
        if (local_59 != 0x20) goto LAB_00135965;
        pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        CVar6 = curlx_strtoofft(pcVar10 + *(long *)(piVar3 + 8),&local_48,10,&local_38);
        if (CVar6 == CURL_OFFT_OK) {
          if (local_38 + 0x7fffffffffffffffU < 0xfffffffffffffffe && *local_48 == '\0') {
            lVar11 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar11 + 0x60);
            *puVar1 = *puVar1 | 0x40;
            *(long *)(lVar11 + 0x28) = local_38;
          }
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          piVar3[1] = 7;
          piVar3[2] = 0;
        }
        break;
      case 7:
        switch(piVar3[2]) {
        case 0:
          if (local_59 != 0x20) {
            if ((9 < (byte)(local_59 - 0x30)) && (0x19 < (byte)((local_59 & 0xdf) + 0xbf)))
            goto LAB_00135e07;
            goto LAB_001357a0;
          }
          break;
        case 1:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 == 0x20) {
LAB_00135aa0:
            piVar3[2] = 2;
          }
          else {
LAB_00135aad:
            if ((0x19 < (byte)(local_59 + 0x9f) && 9 < (byte)(local_59 - 0x30)) &&
               (local_59 != 0x2e && (byte)(local_59 + 0xa5) < 0xe6)) goto LAB_00135e07;
          }
          break;
        case 2:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 != 0x20) {
            if (((byte)(local_59 - 0x30) < 10) || ((byte)((local_59 & 0xdf) + 0xbf) < 0x1a))
            goto LAB_00135bc0;
            goto LAB_00135e07;
          }
          break;
        case 3:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 != 0x20) goto LAB_00135aad;
LAB_00135bfa:
          piVar3[2] = 4;
          break;
        case 4:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 != 0x20) {
            if ((9 < (byte)(local_59 - 0x30)) && (0x19 < (byte)((local_59 & 0xdf) + 0xbf)))
            goto LAB_00135e07;
            piVar3[2] = 5;
          }
          break;
        case 5:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_59 == 0x20) {
            pcVar10[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
            if ((pfVar9->info).filetype == CURLFILETYPE_SYMLINK) {
              piVar3[1] = 9;
              piVar3[2] = 0;
            }
            else {
              piVar3[1] = 8;
              piVar3[2] = 0;
            }
          }
          else if (((((byte)(local_59 - 0x3a) < 0xf6) && ((byte)((local_59 & 0xdf) + 0xa5) < 0xe6))
                   && (local_59 != 0x2e)) && (local_59 != 0x3a)) goto LAB_00135e07;
        }
        break;
      case 8:
        iVar8 = piVar3[2];
        if (iVar8 == 2) {
          if (local_59 != 10) goto LAB_00135e07;
          uVar7 = piVar3[6];
        }
        else {
          if (iVar8 != 1) goto LAB_0013578d;
          uVar7 = piVar3[6] + 1;
          piVar3[6] = uVar7;
          if (local_59 != 10) {
            if (local_59 == 0xd) goto LAB_00135aa0;
            break;
          }
        }
        pcVar10[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        piVar3[1] = 1;
        ftp_pl_insert_finfo(local_50,pfVar9);
        break;
      case 9:
        switch(piVar3[2]) {
        case 0:
switchD_0013559d_caseD_0:
          if (local_59 != 0x20) {
LAB_001357a0:
            *(size_t *)(piVar3 + 8) = sVar14 - 1;
            piVar3[6] = 1;
            piVar3[2] = 1;
          }
          break;
        case 1:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 == 0x20) goto LAB_00135aa0;
          if ((local_59 == 10) || (local_59 == 0xd)) goto LAB_00135e07;
          break;
        case 2:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 != 0x2d) goto LAB_00135bdb;
LAB_00135bc0:
          piVar3[2] = 3;
          break;
        case 3:
          piVar3[6] = piVar3[6] + 1;
          if (local_59 == 0x3e) goto LAB_00135bfa;
LAB_00135bdb:
          if (local_59 != 10) {
joined_r0x00135bab:
            if (local_59 != 0xd) goto LAB_00135bed;
          }
          goto LAB_00135e07;
        case 4:
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_59 != 0x20) {
            if (local_59 == 10) goto LAB_00135e07;
            goto joined_r0x00135bab;
          }
          piVar3[2] = 5;
          pcVar10[((ulong)(iVar8 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          break;
        case 5:
          if ((local_59 == 10) || (local_59 == 0xd)) goto LAB_00135e07;
          piVar3[2] = 6;
          *(size_t *)(piVar3 + 8) = sVar14 - 1;
          piVar3[6] = 1;
          break;
        case 6:
          uVar7 = piVar3[6] + 1;
          piVar3[6] = uVar7;
          if (local_59 == 10) {
LAB_00135d75:
            pcVar10[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
            ftp_pl_insert_finfo(local_50,pfVar9);
            piVar3[1] = 1;
          }
          else if (local_59 == 0xd) {
            piVar3[2] = 7;
          }
          break;
        case 7:
          if (local_59 == 10) {
            uVar7 = piVar3[6];
            goto LAB_00135d75;
          }
LAB_00135e07:
          piVar3[3] = 0x57;
          sVar14 = local_58;
          goto LAB_00135ddf;
        }
      }
switchD_001353a3_default:
      uVar15 = uVar15 + 1;
LAB_00135da1:
      sVar14 = local_58;
    } while (uVar15 < local_58);
  }
  else {
LAB_00135ddf:
    if (*(fileinfo **)(piVar3 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar3 + 4));
      piVar3[4] = 0;
      piVar3[5] = 0;
    }
  }
  return sVar14;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              while(ISBLANK(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(mem + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(mem + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(mem +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}